

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclSharedData.cpp
# Opt level: O2

uint64_t __thiscall xmrig::OclSharedData::adjustDelay(OclSharedData *this,size_t id)

{
  size_t sVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  
  if (this->m_threads < 2) {
    return 0;
  }
  uVar2 = Chrono::steadyMSecs();
  std::mutex::lock(&this->m_mutex);
  uVar4 = this->m_timestamp;
  this->m_timestamp = uVar2;
  lVar5 = uVar2 - uVar4;
  if (lVar5 != 0) {
    auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = 0x45300000;
    dVar8 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    sVar1 = this->m_threads;
    auVar9._8_4_ = (int)(sVar1 >> 0x20);
    auVar9._0_8_ = sVar1;
    auVar9._12_4_ = 0x45300000;
    dVar6 = this->m_averageRunTime /
            ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
    if (dVar8 < this->m_threshold * dVar6) {
      dVar6 = dVar6 - dVar8;
      uVar3 = (ulong)dVar6;
      uVar3 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
      this->m_threshold = 0.75;
      goto LAB_0017087d;
    }
  }
  uVar3 = 0;
LAB_0017087d:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  if (uVar3 == 0) {
    return 0;
  }
  uVar4 = 200;
  if (uVar3 < 400) {
    uVar4 = uVar3;
  }
  local_20.__r = uVar4;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
  return uVar4;
}

Assistant:

uint64_t xmrig::OclSharedData::adjustDelay(size_t id)
{
    if (m_threads < 2) {
        return 0;
    }

    const uint64_t t0 = Chrono::steadyMSecs();
    uint64_t delay    = 0;

    {
        std::lock_guard<std::mutex> lock(m_mutex);

        const uint64_t dt = t0 - m_timestamp;
        m_timestamp = t0;

        // The perfect interleaving is when N threads on the same GPU start with T/N interval between each other
        // If a thread starts earlier than 0.75*T/N ms after the previous thread, delay it to restore perfect interleaving
        if ((dt > 0) && (dt < m_threshold * (m_averageRunTime / m_threads))) {
            delay = static_cast<uint64_t>(m_averageRunTime / m_threads - dt);
            m_threshold = 0.75;
        }
    }

    if (delay == 0) {
        return 0;
    }

    if (delay >= 400) {
        delay = 200;
    }

    std::this_thread::sleep_for(std::chrono::milliseconds(delay));

#   ifdef XMRIG_INTERLEAVE_DEBUG
    LOG_WARN("Thread #%zu was paused for %" PRIu64 " ms to adjust interleaving", id, delay);
#   endif

    return delay;
}